

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct64_stage8_high48_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  __m128i alVar3;
  __m128i alVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  __m128i alVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar9 [16];
  undefined1 auVar14 [16];
  undefined1 auVar19 [16];
  undefined1 auVar24 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  undefined1 auVar39 [16];
  undefined1 auVar10 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  undefined1 auVar35 [16];
  undefined1 auVar40 [16];
  undefined1 auVar11 [16];
  undefined1 auVar16 [16];
  undefined1 auVar21 [16];
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined1 auVar36 [16];
  undefined1 auVar41 [16];
  
  alVar3 = x[0x10];
  alVar4 = x[0x11];
  alVar1 = x[0x12];
  alVar2 = x[0x13];
  alVar72 = (__m128i)paddsw((undefined1  [16])alVar3,(undefined1  [16])x[0x17]);
  x[0x10] = alVar72;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar3,(undefined1  [16])x[0x17]);
  x[0x17] = alVar3;
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x16]);
  x[0x11] = alVar3;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x16]);
  x[0x16] = alVar3;
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0x15]);
  x[0x12] = alVar3;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0x15]);
  x[0x15] = alVar3;
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])x[0x14]);
  x[0x13] = alVar3;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])x[0x14]);
  x[0x14] = alVar3;
  alVar3 = x[0x18];
  alVar4 = (__m128i)psubsw((undefined1  [16])x[0x1f],(undefined1  [16])alVar3);
  x[0x18] = alVar4;
  alVar3 = (__m128i)paddsw((undefined1  [16])x[0x1f],(undefined1  [16])alVar3);
  x[0x1f] = alVar3;
  alVar3 = x[0x19];
  alVar4 = (__m128i)psubsw((undefined1  [16])x[0x1e],(undefined1  [16])alVar3);
  x[0x19] = alVar4;
  alVar3 = (__m128i)paddsw((undefined1  [16])x[0x1e],(undefined1  [16])alVar3);
  x[0x1e] = alVar3;
  alVar3 = x[0x1a];
  alVar4 = (__m128i)psubsw((undefined1  [16])x[0x1d],(undefined1  [16])alVar3);
  x[0x1a] = alVar4;
  alVar3 = (__m128i)paddsw((undefined1  [16])x[0x1d],(undefined1  [16])alVar3);
  x[0x1d] = alVar3;
  alVar3 = x[0x1b];
  alVar4 = (__m128i)psubsw((undefined1  [16])x[0x1c],(undefined1  [16])alVar3);
  x[0x1b] = alVar4;
  alVar3 = (__m128i)paddsw((undefined1  [16])x[0x1c],(undefined1  [16])alVar3);
  x[0x1c] = alVar3;
  alVar3 = x[0x24];
  auVar5._0_12_ = alVar3._0_12_;
  auVar5._12_2_ = alVar3[0]._6_2_;
  auVar5._14_2_ = *(undefined2 *)((long)x[0x3b] + 6);
  auVar73._12_4_ = auVar5._12_4_;
  auVar73._0_10_ = alVar3._0_10_;
  auVar73._10_2_ = *(undefined2 *)((long)x[0x3b] + 4);
  auVar62._10_6_ = auVar73._10_6_;
  auVar62._0_8_ = alVar3[0];
  auVar62._8_2_ = alVar3[0]._4_2_;
  auVar64._8_8_ = auVar62._8_8_;
  auVar64._6_2_ = *(undefined2 *)((long)x[0x3b] + 2);
  auVar64._4_2_ = alVar3[0]._2_2_;
  auVar64._0_2_ = (undefined2)alVar3[0];
  auVar64._2_2_ = (short)x[0x3b][0];
  auVar43._2_2_ = (short)x[0x3b][1];
  auVar43._0_2_ = (short)alVar3[1];
  auVar43._4_2_ = alVar3[1]._2_2_;
  auVar43._6_2_ = *(undefined2 *)((long)x[0x3b] + 10);
  auVar43._8_2_ = alVar3[1]._4_2_;
  auVar43._10_2_ = *(undefined2 *)((long)x[0x3b] + 0xc);
  auVar43._12_2_ = alVar3[1]._6_2_;
  auVar43._14_2_ = *(undefined2 *)((long)x[0x3b] + 0xe);
  auVar60._8_4_ = 0x61ff138;
  auVar60._0_8_ = 0x61ff138061ff138;
  auVar60._12_4_ = 0x61ff138;
  auVar62 = pmaddwd(auVar64,auVar60);
  auVar73 = pmaddwd(auVar43,auVar60);
  auVar51._8_4_ = 0xec8061f;
  auVar51._0_8_ = 0xec8061f0ec8061f;
  auVar51._12_4_ = 0xec8061f;
  auVar6 = pmaddwd(auVar64,auVar51);
  auVar44 = pmaddwd(auVar43,auVar51);
  auVar63._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar63._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar63._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar63._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  auVar74._0_4_ = auVar73._0_4_ + in_XMM0_Da >> 0xc;
  auVar74._4_4_ = auVar73._4_4_ + in_XMM0_Db >> 0xc;
  auVar74._8_4_ = auVar73._8_4_ + in_XMM0_Dc >> 0xc;
  auVar74._12_4_ = auVar73._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar63,auVar74);
  auVar7._0_4_ = auVar6._0_4_ + in_XMM0_Da >> 0xc;
  auVar7._4_4_ = auVar6._4_4_ + in_XMM0_Db >> 0xc;
  auVar7._8_4_ = auVar6._8_4_ + in_XMM0_Dc >> 0xc;
  auVar7._12_4_ = auVar6._12_4_ + in_XMM0_Dd >> 0xc;
  auVar45._0_4_ = auVar44._0_4_ + in_XMM0_Da >> 0xc;
  auVar45._4_4_ = auVar44._4_4_ + in_XMM0_Db >> 0xc;
  auVar45._8_4_ = auVar44._8_4_ + in_XMM0_Dc >> 0xc;
  auVar45._12_4_ = auVar44._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar7,auVar45);
  x[0x24] = alVar4;
  x[0x3b] = alVar3;
  alVar3 = x[0x25];
  auVar11._0_12_ = alVar3._0_12_;
  auVar11._12_2_ = alVar3[0]._6_2_;
  auVar11._14_2_ = *(undefined2 *)((long)x[0x3a] + 6);
  auVar10._12_4_ = auVar11._12_4_;
  auVar10._0_10_ = alVar3._0_10_;
  auVar10._10_2_ = *(undefined2 *)((long)x[0x3a] + 4);
  auVar9._10_6_ = auVar10._10_6_;
  auVar9._0_8_ = alVar3[0];
  auVar9._8_2_ = alVar3[0]._4_2_;
  auVar8._8_8_ = auVar9._8_8_;
  auVar8._6_2_ = *(undefined2 *)((long)x[0x3a] + 2);
  auVar8._4_2_ = alVar3[0]._2_2_;
  auVar8._0_2_ = (undefined2)alVar3[0];
  auVar8._2_2_ = (short)x[0x3a][0];
  auVar46._2_2_ = (short)x[0x3a][1];
  auVar46._0_2_ = (short)alVar3[1];
  auVar46._4_2_ = alVar3[1]._2_2_;
  auVar46._6_2_ = *(undefined2 *)((long)x[0x3a] + 10);
  auVar46._8_2_ = alVar3[1]._4_2_;
  auVar46._10_2_ = *(undefined2 *)((long)x[0x3a] + 0xc);
  auVar46._12_2_ = alVar3[1]._6_2_;
  auVar46._14_2_ = *(undefined2 *)((long)x[0x3a] + 0xe);
  auVar64 = pmaddwd(auVar8,auVar60);
  auVar62 = pmaddwd(auVar46,auVar60);
  auVar6 = pmaddwd(auVar8,auVar51);
  auVar44 = pmaddwd(auVar46,auVar51);
  auVar65._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar65._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar65._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar65._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  auVar75._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar75._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar75._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar75._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar65,auVar75);
  auVar12._0_4_ = auVar6._0_4_ + in_XMM0_Da >> 0xc;
  auVar12._4_4_ = auVar6._4_4_ + in_XMM0_Db >> 0xc;
  auVar12._8_4_ = auVar6._8_4_ + in_XMM0_Dc >> 0xc;
  auVar12._12_4_ = auVar6._12_4_ + in_XMM0_Dd >> 0xc;
  auVar47._0_4_ = auVar44._0_4_ + in_XMM0_Da >> 0xc;
  auVar47._4_4_ = auVar44._4_4_ + in_XMM0_Db >> 0xc;
  auVar47._8_4_ = auVar44._8_4_ + in_XMM0_Dc >> 0xc;
  auVar47._12_4_ = auVar44._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar12,auVar47);
  x[0x25] = alVar4;
  x[0x3a] = alVar3;
  alVar3 = x[0x26];
  auVar16._0_12_ = alVar3._0_12_;
  auVar16._12_2_ = alVar3[0]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)x[0x39] + 6);
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = alVar3._0_10_;
  auVar15._10_2_ = *(undefined2 *)((long)x[0x39] + 4);
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = alVar3[0];
  auVar14._8_2_ = alVar3[0]._4_2_;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._6_2_ = *(undefined2 *)((long)x[0x39] + 2);
  auVar13._4_2_ = alVar3[0]._2_2_;
  auVar13._0_2_ = (undefined2)alVar3[0];
  auVar13._2_2_ = (short)x[0x39][0];
  auVar48._2_2_ = (short)x[0x39][1];
  auVar48._0_2_ = (short)alVar3[1];
  auVar48._4_2_ = alVar3[1]._2_2_;
  auVar48._6_2_ = *(undefined2 *)((long)x[0x39] + 10);
  auVar48._8_2_ = alVar3[1]._4_2_;
  auVar48._10_2_ = *(undefined2 *)((long)x[0x39] + 0xc);
  auVar48._12_2_ = alVar3[1]._6_2_;
  auVar48._14_2_ = *(undefined2 *)((long)x[0x39] + 0xe);
  auVar64 = pmaddwd(auVar13,auVar60);
  auVar62 = pmaddwd(auVar48,auVar60);
  auVar6 = pmaddwd(auVar13,auVar51);
  auVar44 = pmaddwd(auVar48,auVar51);
  auVar66._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar66._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar66._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar66._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  auVar76._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar76._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar76._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar76._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar66,auVar76);
  auVar17._0_4_ = auVar6._0_4_ + in_XMM0_Da >> 0xc;
  auVar17._4_4_ = auVar6._4_4_ + in_XMM0_Db >> 0xc;
  auVar17._8_4_ = auVar6._8_4_ + in_XMM0_Dc >> 0xc;
  auVar17._12_4_ = auVar6._12_4_ + in_XMM0_Dd >> 0xc;
  auVar49._0_4_ = auVar44._0_4_ + in_XMM0_Da >> 0xc;
  auVar49._4_4_ = auVar44._4_4_ + in_XMM0_Db >> 0xc;
  auVar49._8_4_ = auVar44._8_4_ + in_XMM0_Dc >> 0xc;
  auVar49._12_4_ = auVar44._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar17,auVar49);
  x[0x26] = alVar4;
  x[0x39] = alVar3;
  alVar3 = x[0x27];
  auVar21._0_12_ = alVar3._0_12_;
  auVar21._12_2_ = alVar3[0]._6_2_;
  auVar21._14_2_ = *(undefined2 *)((long)x[0x38] + 6);
  auVar20._12_4_ = auVar21._12_4_;
  auVar20._0_10_ = alVar3._0_10_;
  auVar20._10_2_ = *(undefined2 *)((long)x[0x38] + 4);
  auVar19._10_6_ = auVar20._10_6_;
  auVar19._0_8_ = alVar3[0];
  auVar19._8_2_ = alVar3[0]._4_2_;
  auVar18._8_8_ = auVar19._8_8_;
  auVar18._6_2_ = *(undefined2 *)((long)x[0x38] + 2);
  auVar18._4_2_ = alVar3[0]._2_2_;
  auVar18._0_2_ = (undefined2)alVar3[0];
  auVar18._2_2_ = (short)x[0x38][0];
  auVar50._2_2_ = (short)x[0x38][1];
  auVar50._0_2_ = (short)alVar3[1];
  auVar50._4_2_ = alVar3[1]._2_2_;
  auVar50._6_2_ = *(undefined2 *)((long)x[0x38] + 10);
  auVar50._8_2_ = alVar3[1]._4_2_;
  auVar50._10_2_ = *(undefined2 *)((long)x[0x38] + 0xc);
  auVar50._12_2_ = alVar3[1]._6_2_;
  auVar50._14_2_ = *(undefined2 *)((long)x[0x38] + 0xe);
  auVar44 = pmaddwd(auVar18,auVar60);
  auVar64 = pmaddwd(auVar50,auVar60);
  auVar6 = pmaddwd(auVar18,auVar51);
  auVar51 = pmaddwd(auVar50,auVar51);
  auVar67._0_4_ = auVar44._0_4_ + in_XMM0_Da >> 0xc;
  auVar67._4_4_ = auVar44._4_4_ + in_XMM0_Db >> 0xc;
  auVar67._8_4_ = auVar44._8_4_ + in_XMM0_Dc >> 0xc;
  auVar67._12_4_ = auVar44._12_4_ + in_XMM0_Dd >> 0xc;
  auVar77._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar77._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar77._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar77._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar67,auVar77);
  auVar22._0_4_ = auVar6._0_4_ + in_XMM0_Da >> 0xc;
  auVar22._4_4_ = auVar6._4_4_ + in_XMM0_Db >> 0xc;
  auVar22._8_4_ = auVar6._8_4_ + in_XMM0_Dc >> 0xc;
  auVar22._12_4_ = auVar6._12_4_ + in_XMM0_Dd >> 0xc;
  auVar52._0_4_ = auVar51._0_4_ + in_XMM0_Da >> 0xc;
  auVar52._4_4_ = auVar51._4_4_ + in_XMM0_Db >> 0xc;
  auVar52._8_4_ = auVar51._8_4_ + in_XMM0_Dc >> 0xc;
  auVar52._12_4_ = auVar51._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar22,auVar52);
  x[0x27] = alVar4;
  x[0x38] = alVar3;
  alVar3 = x[0x28];
  auVar26._0_12_ = alVar3._0_12_;
  auVar26._12_2_ = alVar3[0]._6_2_;
  auVar26._14_2_ = *(undefined2 *)((long)x[0x37] + 6);
  auVar25._12_4_ = auVar26._12_4_;
  auVar25._0_10_ = alVar3._0_10_;
  auVar25._10_2_ = *(undefined2 *)((long)x[0x37] + 4);
  auVar24._10_6_ = auVar25._10_6_;
  auVar24._0_8_ = alVar3[0];
  auVar24._8_2_ = alVar3[0]._4_2_;
  auVar23._8_8_ = auVar24._8_8_;
  auVar23._6_2_ = *(undefined2 *)((long)x[0x37] + 2);
  auVar23._4_2_ = alVar3[0]._2_2_;
  auVar23._0_2_ = (undefined2)alVar3[0];
  auVar23._2_2_ = (short)x[0x37][0];
  auVar53._2_2_ = (short)x[0x37][1];
  auVar53._0_2_ = (short)alVar3[1];
  auVar53._4_2_ = alVar3[1]._2_2_;
  auVar53._6_2_ = *(undefined2 *)((long)x[0x37] + 10);
  auVar53._8_2_ = alVar3[1]._4_2_;
  auVar53._10_2_ = *(undefined2 *)((long)x[0x37] + 0xc);
  auVar53._12_2_ = alVar3[1]._6_2_;
  auVar53._14_2_ = *(undefined2 *)((long)x[0x37] + 0xe);
  auVar6._8_4_ = 0xf138f9e1;
  auVar6._0_8_ = 0xf138f9e1f138f9e1;
  auVar6._12_4_ = 0xf138f9e1;
  auVar64 = pmaddwd(auVar23,auVar6);
  auVar62 = pmaddwd(auVar53,auVar6);
  auVar51 = pmaddwd(auVar23,auVar60);
  auVar44 = pmaddwd(auVar53,auVar60);
  auVar68._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar68._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar68._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar68._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  auVar78._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar78._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar78._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar78._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar68,auVar78);
  auVar27._0_4_ = auVar51._0_4_ + in_XMM0_Da >> 0xc;
  auVar27._4_4_ = auVar51._4_4_ + in_XMM0_Db >> 0xc;
  auVar27._8_4_ = auVar51._8_4_ + in_XMM0_Dc >> 0xc;
  auVar27._12_4_ = auVar51._12_4_ + in_XMM0_Dd >> 0xc;
  auVar54._0_4_ = auVar44._0_4_ + in_XMM0_Da >> 0xc;
  auVar54._4_4_ = auVar44._4_4_ + in_XMM0_Db >> 0xc;
  auVar54._8_4_ = auVar44._8_4_ + in_XMM0_Dc >> 0xc;
  auVar54._12_4_ = auVar44._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar27,auVar54);
  x[0x28] = alVar4;
  x[0x37] = alVar3;
  alVar3 = x[0x29];
  auVar31._0_12_ = alVar3._0_12_;
  auVar31._12_2_ = alVar3[0]._6_2_;
  auVar31._14_2_ = *(undefined2 *)((long)x[0x36] + 6);
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_10_ = alVar3._0_10_;
  auVar30._10_2_ = *(undefined2 *)((long)x[0x36] + 4);
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._0_8_ = alVar3[0];
  auVar29._8_2_ = alVar3[0]._4_2_;
  auVar28._8_8_ = auVar29._8_8_;
  auVar28._6_2_ = *(undefined2 *)((long)x[0x36] + 2);
  auVar28._4_2_ = alVar3[0]._2_2_;
  auVar28._0_2_ = (undefined2)alVar3[0];
  auVar28._2_2_ = (short)x[0x36][0];
  auVar55._2_2_ = (short)x[0x36][1];
  auVar55._0_2_ = (short)alVar3[1];
  auVar55._4_2_ = alVar3[1]._2_2_;
  auVar55._6_2_ = *(undefined2 *)((long)x[0x36] + 10);
  auVar55._8_2_ = alVar3[1]._4_2_;
  auVar55._10_2_ = *(undefined2 *)((long)x[0x36] + 0xc);
  auVar55._12_2_ = alVar3[1]._6_2_;
  auVar55._14_2_ = *(undefined2 *)((long)x[0x36] + 0xe);
  auVar64 = pmaddwd(auVar28,auVar6);
  auVar62 = pmaddwd(auVar55,auVar6);
  auVar51 = pmaddwd(auVar28,auVar60);
  auVar44 = pmaddwd(auVar55,auVar60);
  auVar69._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar69._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar69._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar69._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  auVar79._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar79._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar79._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar79._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar69,auVar79);
  auVar32._0_4_ = auVar51._0_4_ + in_XMM0_Da >> 0xc;
  auVar32._4_4_ = auVar51._4_4_ + in_XMM0_Db >> 0xc;
  auVar32._8_4_ = auVar51._8_4_ + in_XMM0_Dc >> 0xc;
  auVar32._12_4_ = auVar51._12_4_ + in_XMM0_Dd >> 0xc;
  auVar56._0_4_ = auVar44._0_4_ + in_XMM0_Da >> 0xc;
  auVar56._4_4_ = auVar44._4_4_ + in_XMM0_Db >> 0xc;
  auVar56._8_4_ = auVar44._8_4_ + in_XMM0_Dc >> 0xc;
  auVar56._12_4_ = auVar44._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar32,auVar56);
  x[0x29] = alVar4;
  x[0x36] = alVar3;
  alVar3 = x[0x2a];
  auVar36._0_12_ = alVar3._0_12_;
  auVar36._12_2_ = alVar3[0]._6_2_;
  auVar36._14_2_ = *(undefined2 *)((long)x[0x35] + 6);
  auVar35._12_4_ = auVar36._12_4_;
  auVar35._0_10_ = alVar3._0_10_;
  auVar35._10_2_ = *(undefined2 *)((long)x[0x35] + 4);
  auVar34._10_6_ = auVar35._10_6_;
  auVar34._0_8_ = alVar3[0];
  auVar34._8_2_ = alVar3[0]._4_2_;
  auVar33._8_8_ = auVar34._8_8_;
  auVar33._6_2_ = *(undefined2 *)((long)x[0x35] + 2);
  auVar33._4_2_ = alVar3[0]._2_2_;
  auVar33._0_2_ = (undefined2)alVar3[0];
  auVar33._2_2_ = (short)x[0x35][0];
  auVar57._2_2_ = (short)x[0x35][1];
  auVar57._0_2_ = (short)alVar3[1];
  auVar57._4_2_ = alVar3[1]._2_2_;
  auVar57._6_2_ = *(undefined2 *)((long)x[0x35] + 10);
  auVar57._8_2_ = alVar3[1]._4_2_;
  auVar57._10_2_ = *(undefined2 *)((long)x[0x35] + 0xc);
  auVar57._12_2_ = alVar3[1]._6_2_;
  auVar57._14_2_ = *(undefined2 *)((long)x[0x35] + 0xe);
  auVar64 = pmaddwd(auVar33,auVar6);
  auVar62 = pmaddwd(auVar57,auVar6);
  auVar51 = pmaddwd(auVar33,auVar60);
  auVar44 = pmaddwd(auVar57,auVar60);
  auVar70._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar70._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar70._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar70._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  auVar80._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar80._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar80._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar80._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar70,auVar80);
  auVar37._0_4_ = auVar51._0_4_ + in_XMM0_Da >> 0xc;
  auVar37._4_4_ = auVar51._4_4_ + in_XMM0_Db >> 0xc;
  auVar37._8_4_ = auVar51._8_4_ + in_XMM0_Dc >> 0xc;
  auVar37._12_4_ = auVar51._12_4_ + in_XMM0_Dd >> 0xc;
  auVar58._0_4_ = auVar44._0_4_ + in_XMM0_Da >> 0xc;
  auVar58._4_4_ = auVar44._4_4_ + in_XMM0_Db >> 0xc;
  auVar58._8_4_ = auVar44._8_4_ + in_XMM0_Dc >> 0xc;
  auVar58._12_4_ = auVar44._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar37,auVar58);
  x[0x2a] = alVar4;
  x[0x35] = alVar3;
  alVar3 = x[0x2b];
  auVar41._0_12_ = alVar3._0_12_;
  auVar41._12_2_ = alVar3[0]._6_2_;
  auVar41._14_2_ = *(undefined2 *)((long)x[0x34] + 6);
  auVar40._12_4_ = auVar41._12_4_;
  auVar40._0_10_ = alVar3._0_10_;
  auVar40._10_2_ = *(undefined2 *)((long)x[0x34] + 4);
  auVar39._10_6_ = auVar40._10_6_;
  auVar39._0_8_ = alVar3[0];
  auVar39._8_2_ = alVar3[0]._4_2_;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._6_2_ = *(undefined2 *)((long)x[0x34] + 2);
  auVar38._4_2_ = alVar3[0]._2_2_;
  auVar38._0_2_ = (undefined2)alVar3[0];
  auVar38._2_2_ = (short)x[0x34][0];
  auVar59._2_2_ = (short)x[0x34][1];
  auVar59._0_2_ = (short)alVar3[1];
  auVar59._4_2_ = alVar3[1]._2_2_;
  auVar59._6_2_ = *(undefined2 *)((long)x[0x34] + 10);
  auVar59._8_2_ = alVar3[1]._4_2_;
  auVar59._10_2_ = *(undefined2 *)((long)x[0x34] + 0xc);
  auVar59._12_2_ = alVar3[1]._6_2_;
  auVar59._14_2_ = *(undefined2 *)((long)x[0x34] + 0xe);
  auVar44 = pmaddwd(auVar38,auVar6);
  auVar51 = pmaddwd(auVar6,auVar59);
  auVar6 = pmaddwd(auVar38,auVar60);
  auVar60 = pmaddwd(auVar59,auVar60);
  auVar71._0_4_ = auVar44._0_4_ + in_XMM0_Da >> 0xc;
  auVar71._4_4_ = auVar44._4_4_ + in_XMM0_Db >> 0xc;
  auVar71._8_4_ = auVar44._8_4_ + in_XMM0_Dc >> 0xc;
  auVar71._12_4_ = auVar44._12_4_ + in_XMM0_Dd >> 0xc;
  auVar44._0_4_ = auVar51._0_4_ + in_XMM0_Da >> 0xc;
  auVar44._4_4_ = auVar51._4_4_ + in_XMM0_Db >> 0xc;
  auVar44._8_4_ = auVar51._8_4_ + in_XMM0_Dc >> 0xc;
  auVar44._12_4_ = auVar51._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar71,auVar44);
  auVar42._0_4_ = auVar6._0_4_ + in_XMM0_Da >> 0xc;
  auVar42._4_4_ = auVar6._4_4_ + in_XMM0_Db >> 0xc;
  auVar42._8_4_ = auVar6._8_4_ + in_XMM0_Dc >> 0xc;
  auVar42._12_4_ = auVar6._12_4_ + in_XMM0_Dd >> 0xc;
  auVar61._0_4_ = auVar60._0_4_ + in_XMM0_Da >> 0xc;
  auVar61._4_4_ = auVar60._4_4_ + in_XMM0_Db >> 0xc;
  auVar61._8_4_ = auVar60._8_4_ + in_XMM0_Dc >> 0xc;
  auVar61._12_4_ = auVar60._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar42,auVar61);
  x[0x2b] = alVar4;
  x[0x34] = alVar3;
  return;
}

Assistant:

static inline void idct64_stage8_high48_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  btf_16_adds_subs_sse2(x[16], x[23]);
  btf_16_adds_subs_sse2(x[17], x[22]);
  btf_16_adds_subs_sse2(x[18], x[21]);
  btf_16_adds_subs_sse2(x[19], x[20]);
  btf_16_subs_adds_sse2(x[31], x[24]);
  btf_16_subs_adds_sse2(x[30], x[25]);
  btf_16_subs_adds_sse2(x[29], x[26]);
  btf_16_subs_adds_sse2(x[28], x[27]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[36], x[59], x[36], x[59]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[37], x[58], x[37], x[58]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[38], x[57], x[38], x[57]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[39], x[56], x[39], x[56]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[40], x[55], x[40], x[55]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[41], x[54], x[41], x[54]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[42], x[53], x[42], x[53]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[43], x[52], x[43], x[52]);
}